

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_echocli.cpp
# Opt level: O1

void AddSuccCnt(void)

{
  time_t tVar1;
  
  tVar1 = time((time_t *)0x0);
  if (iTime < (int)tVar1) {
    printf("time %d Succ Cnt %d Fail Cnt %d\n",(ulong)(uint)iTime,(ulong)(uint)iSuccCnt,
           (ulong)(uint)iFailCnt);
    iSuccCnt = 0;
    iFailCnt = 0;
    iTime = (int)tVar1;
  }
  else {
    iSuccCnt = iSuccCnt + 1;
  }
  return;
}

Assistant:

void AddSuccCnt()
{
	int now = time(NULL);
	if (now >iTime)
	{
		printf("time %d Succ Cnt %d Fail Cnt %d\n", iTime, iSuccCnt, iFailCnt);
		iTime = now;
		iSuccCnt = 0;
		iFailCnt = 0;
	}
	else
	{
		iSuccCnt++;
	}
}